

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNSym::gen_code_call(CTPNSym *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  CTcPrsSymtab *sym;
  CTcPrsSymtab *this_00;
  CTcSymbol *pCVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  
  sym = CTcCodeStream::get_symtab(G_cs);
  this_00 = (CTcPrsSymtab *)(**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RDI + 0x68))();
  CTcCodeStream::is_self_available(G_cs);
  pCVar1 = CTcPrsSymtab::find_or_def_prop_implied
                     (this_00,(char *)sym,(size_t)in_RDI,in_stack_ffffffffffffffbc,
                      in_stack_ffffffffffffffb8);
  (*(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1b])
            (pCVar1,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX,in_R8);
  return;
}

Assistant:

void CTPNSym::gen_code_call(int discard, int argc, int varargs,
                            CTcNamedArgs *named_args)
{
    /*
     *   Look up our symbol in the symbol table, then ask the resulting
     *   symbol to generate the appropriate call.  The symbol is
     *   implicitly a property (if in a method context), since that's the
     *   only kind of undefined symbol that we could be calling.  
     */
    G_cs->get_symtab()
        ->find_or_def_prop_implied(get_sym_text(), get_sym_text_len(),
                                   FALSE, G_cs->is_self_available())
        ->gen_code_call(discard, argc, varargs, named_args);
}